

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler_unittest.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_3c85::ProfileHandlerTest::StopWorker(ProfileHandlerTest *this)

{
  ProfileHandlerTest *this_local;
  
  BusyThread::set_stop_work(this->busy_worker_,true);
  Thread::Join(&this->busy_worker_->super_Thread);
  if (this->busy_worker_ != (BusyThread *)0x0) {
    (*(this->busy_worker_->super_Thread)._vptr_Thread[1])();
  }
  return;
}

Assistant:

void StopWorker() {
    busy_worker_->set_stop_work(true);
    busy_worker_->Join();
    delete busy_worker_;
  }